

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdump::BeginGlobal
          (BinaryReaderObjdump *this,Index index,Type type,bool mutable_)

{
  bool bVar1;
  undefined8 uVar2;
  size_type sVar3;
  const_pointer pvVar4;
  undefined1 local_58 [8];
  string_view name;
  bool mutable__local;
  Index index_local;
  BinaryReaderObjdump *this_local;
  Type type_local;
  
  unique0x10000145 = type;
  Type::GetName_abi_cxx11_((string *)&name._M_str,(Type *)((long)&this_local + 4));
  uVar2 = std::__cxx11::string::c_str();
  PrintDetails(this," - global[%u] %s mutable=%d",(ulong)index,uVar2,(ulong)mutable_);
  std::__cxx11::string::~string((string *)&name._M_str);
  _local_58 = BinaryReaderObjdumpBase::GetGlobalName(&this->super_BinaryReaderObjdumpBase,index);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_58);
  if (!bVar1) {
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_58);
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_58);
    PrintDetails(this," <%.*s>",sVar3 & 0xffffffff,pvVar4);
  }
  Result::Result((Result *)&type_local,Ok);
  return (Result)type_local.enum_;
}

Assistant:

Result BinaryReaderObjdump::BeginGlobal(Index index, Type type, bool mutable_) {
  PrintDetails(" - global[%" PRIindex "] %s mutable=%d", index,
               type.GetName().c_str(), mutable_);
  std::string_view name = GetGlobalName(index);
  if (!name.empty()) {
    PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  return Result::Ok;
}